

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::copy_val(char *dst,char *src,int round)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = *(ushort *)src;
  uVar2 = *(ushort *)dst;
  if (uVar1 < uVar2) {
    uVar4 = (ulong)(uVar1 + 1 >> 1);
    memcpy(dst + 2,src + 2,uVar4 + 3);
    memset(dst + uVar4 + 5,0,(uVar2 + 1 >> 1) - uVar4);
    dst[(ulong)(uVar1 >> 1) + 5] = dst[(ulong)(uVar1 >> 1) + 5] & '\x0f' << (((byte)uVar1 & 1) << 2)
    ;
  }
  else {
    memcpy(dst + 2,src + 2,(ulong)(uVar2 + 1 >> 1) + 3);
    if (round != 0) {
      iVar3 = get_round_dir(src,(uint)uVar2);
      if (iVar3 != 0) {
        round_up_abs(dst,(uint)uVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::copy_val(char *dst, const char *src, int round)
{
    size_t src_prec = get_prec(src);
    size_t dst_prec = get_prec(dst);

    /* check to see if we're growing or shrinking */
    if (dst_prec > src_prec)
    {
        /* 
         *   it's growing - copy the entire old mantissa, plus the flags,
         *   sign, and exponent 
         */
        memcpy(dst + VMBN_EXP, src + VMBN_EXP,
               (VMBN_MANT - VMBN_EXP) + (src_prec + 1)/2);

        /* clear the balance of the mantissa */
        memset(dst + VMBN_MANT + (src_prec + 1)/2,
               0, (dst_prec + 1)/2 - (src_prec + 1)/2);

        /* 
         *   clear the digit just after the last digit we copied - we might
         *   have missed this with the memset, since it only deals with
         *   even-numbered pairs of digits
         */
        set_dig(dst, src_prec, 0);
    }
    else
    {
        /* it's shrinking - truncate the mantissa to the new length */
        memcpy(dst + VMBN_EXP, src + VMBN_EXP,
               (VMBN_MANT - VMBN_EXP) + (dst_prec + 1)/2);

        /* check for rounding */
        if (round && get_round_dir(src, dst_prec))
            round_up_abs(dst);
    }
}